

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

void luaH_resize(lua_State *L,Table *t,uint nasize,uint nhsize)

{
  uint size;
  Node *block;
  undefined4 uVar1;
  int iVar2;
  TValue *pTVar3;
  Node *pNVar4;
  uint local_5c;
  TValue *io1;
  Node *old;
  Node *nold;
  int oldhsize;
  uint oldasize;
  AuxsetnodeT asn;
  int j;
  uint i;
  uint nhsize_local;
  uint nasize_local;
  Table *t_local;
  lua_State *L_local;
  
  size = t->sizearray;
  if (t->lastfree == (Node *)0x0) {
    local_5c = 0;
  }
  else {
    local_5c = 1 << (t->lsizenode & 0x1f);
  }
  block = t->node;
  if (size < nasize) {
    setarrayvector(L,t,nasize);
  }
  _oldhsize = t;
  asn.t._0_4_ = nhsize;
  iVar2 = luaD_rawrunprotected(L,auxsetnode,&oldhsize);
  if (iVar2 == 0) {
    asn.nhsize = local_5c;
    if (nasize < size) {
      t->sizearray = nasize;
      for (asn._12_4_ = nasize; (uint)asn._12_4_ < size; asn._12_4_ = asn._12_4_ + 1) {
        if (t->array[(uint)asn._12_4_].tt_ != 0) {
          luaH_setint(L,t,(ulong)(asn._12_4_ + 1),t->array + (uint)asn._12_4_);
        }
      }
      pTVar3 = (TValue *)luaM_realloc_(L,t->array,(ulong)size << 4,(ulong)nasize << 4);
      t->array = pTVar3;
    }
    while (asn.nhsize = asn.nhsize - 1, -1 < (int)asn.nhsize) {
      pNVar4 = block + (int)asn.nhsize;
      if ((pNVar4->i_val).tt_ != 0) {
        pTVar3 = luaH_set(L,t,&(pNVar4->i_key).tvk);
        pTVar3->value_ = (pNVar4->i_val).value_;
        uVar1 = *(undefined4 *)&(pNVar4->i_val).field_0xc;
        pTVar3->tt_ = (pNVar4->i_val).tt_;
        *(undefined4 *)&pTVar3->field_0xc = uVar1;
      }
    }
    if (0 < (int)local_5c) {
      luaM_realloc_(L,block,(long)(int)local_5c << 5,0);
    }
    return;
  }
  setarrayvector(L,t,size);
  luaD_throw(L,4);
}

Assistant:

void luaH_resize (lua_State *L, Table *t, unsigned int nasize,
                                          unsigned int nhsize) {
  unsigned int i;
  int j;
  AuxsetnodeT asn;
  unsigned int oldasize = t->sizearray;
  int oldhsize = allocsizenode(t);
  Node *nold = t->node;  /* save old hash ... */
  if (nasize > oldasize)  /* array part must grow? */
    setarrayvector(L, t, nasize);
  /* create new hash part with appropriate size */
  asn.t = t; asn.nhsize = nhsize;
  if (luaD_rawrunprotected(L, auxsetnode, &asn) != LUA_OK) {  /* mem. error? */
    setarrayvector(L, t, oldasize);  /* array back to its original size */
    luaD_throw(L, LUA_ERRMEM);  /* rethrow memory error */
  }
  if (nasize < oldasize) {  /* array part must shrink? */
    t->sizearray = nasize;
    /* re-insert elements from vanishing slice */
    for (i=nasize; i<oldasize; i++) {
      if (!ttisnil(&t->array[i]))
        luaH_setint(L, t, i + 1, &t->array[i]);
    }
    /* shrink array */
    luaM_reallocvector(L, t->array, oldasize, nasize, TValue);
  }
  /* re-insert elements from hash part */
  for (j = oldhsize - 1; j >= 0; j--) {
    Node *old = nold + j;
    if (!ttisnil(gval(old))) {
      /* doesn't need barrier/invalidate cache, as entry was
         already present in the table */
      setobjt2t(L, luaH_set(L, t, gkey(old)), gval(old));
    }
  }
  if (oldhsize > 0)  /* not the dummy node? */
    luaM_freearray(L, nold, cast(size_t, oldhsize)); /* free old hash */
}